

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void Curl_hash_start_iterate(Curl_hash *hash,Curl_hash_iterator *iter)

{
  Curl_hash_iterator *iter_local;
  Curl_hash *hash_local;
  
  iter->hash = hash;
  iter->slot_index = 0;
  iter->current = (Curl_hash_element *)0x0;
  return;
}

Assistant:

void Curl_hash_start_iterate(struct Curl_hash *hash,
                             struct Curl_hash_iterator *iter)
{
  DEBUGASSERT(hash->init == HASHINIT);
  iter->hash = hash;
  iter->slot_index = 0;
  iter->current = NULL;
#ifdef DEBUGBUILD
  iter->init = ITERINIT;
#endif
}